

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkRegressor::NeuralNetworkRegressor(NeuralNetworkRegressor *this)

{
  NeuralNetworkRegressor *pNVar1;
  NeuralNetworkRegressor *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NeuralNetworkRegressor_00d5b0a8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::RepeatedPtrField
            (&this->layers_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::
  RepeatedPtrField(&this->preprocessing_);
  pNVar1 = internal_default_instance();
  if (this != pNVar1) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

NeuralNetworkRegressor::NeuralNetworkRegressor()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NeuralNetworkRegressor)
}